

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O2

RK_S32 mpp_enc_refs_next_frm_is_intra(MppEncRefs refs)

{
  uint uVar1;
  uint uVar2;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_next_frm_is_intra");
    uVar2 = 0xfffffffa;
  }
  else {
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_next_frm_is_intra",refs);
    }
    uVar1 = *refs >> 2 & 1;
    if ((*(int *)((long)refs + 0x30) != 0) &&
       (*(int *)((long)refs + 0x30) <= *(int *)((long)refs + 0x5d4))) {
      uVar1 = 1;
    }
    uVar2 = 1;
    if ((*(byte *)((long)refs + 0x10) & 1) == 0) {
      uVar2 = uVar1;
    }
    if (*(int *)((long)refs + 0x5d0) == 0) {
      uVar2 = 0;
    }
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_next_frm_is_intra",refs);
    }
  }
  return uVar2;
}

Assistant:

RK_S32 mpp_enc_refs_next_frm_is_intra(MppEncRefs refs)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    EncVirtualCpb *cpb = &p->cpb;
    MppEncRefFrmUsrCfg *usr_cfg = &p->usr_cfg;
    RK_S32 is_intra = 0;

    if (p->changed & ENC_REFS_IGOP_CHANGED)
        is_intra = 1;

    if (p->igop && cpb->seq_idx >= p->igop)
        is_intra = 1;

    if (usr_cfg->force_flag & ENC_FORCE_IDR)
        is_intra = 1;

    if (!cpb->frm_idx)
        is_intra = 0;

    enc_refs_dbg_func("leave %p\n", refs);

    return is_intra;
}